

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-sharedata.c
# Opt level: O0

int lupdate(lua_State *L)

{
  int iVar1;
  char *__src;
  char *tmp;
  size_t sz;
  void *msg;
  boxstm *box;
  lua_State *L_local;
  
  box = (boxstm *)L;
  msg = lua_touserdata(L,1);
  iVar1 = lua_isuserdata((lua_State *)box,2);
  if (iVar1 == 0) {
    __src = luaL_checklstring((lua_State *)box,2,(size_t *)&tmp);
    sz = (size_t)malloc((size_t)tmp);
    memcpy((void *)sz,__src,(size_t)tmp);
  }
  else {
    sz = (size_t)lua_touserdata((lua_State *)box,2);
    tmp = (char *)luaL_checkinteger((lua_State *)box,3);
  }
  stm_update(*msg,(void *)sz,(int32_t)tmp);
  return 0;
}

Assistant:

static int
lupdate(lua_State *L) {
	luaL_checktype(L, 1, LUA_TUSERDATA);
	luaL_checktype(L, 2, LUA_TLIGHTUSERDATA);
	luaL_checktype(L, 3, LUA_TTABLE);
	struct ctrl * c= lua_touserdata(L, 1);
	struct table *n = lua_touserdata(L, 2);
	if (c->root == n) {
		return luaL_error(L, "You should update a new object");
	}
	lua_settop(L, 3);
	lua_setuservalue(L, 1);
	c->update = n;

	return 0;
}